

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

void __thiscall cs_impl::any::any<cs::type_id>(any *this,type_id *dat)

{
  proxy *ppVar1;
  int local_1c;
  holder<cs::type_id> *local_18;
  
  local_1c = 1;
  local_18 = cs::
             allocator_type<cs_impl::any::holder<cs::type_id>,64ul,cs_impl::default_allocator_provider>
             ::alloc<cs::type_id_const&>
                       ((allocator_type<cs_impl::any::holder<cs::type_id>,64ul,cs_impl::default_allocator_provider>
                         *)holder<cs::type_id>::allocator,dat);
  ppVar1 = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
           alloc<int,cs_impl::any::holder<cs::type_id>*>
                     ((allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>
                       *)allocator,&local_1c,&local_18);
  this->mDat = ppVar1;
  return;
}

Assistant:

any(const T &dat):mDat(allocator.alloc(1, holder<T>::allocator.alloc(dat))) {}